

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_frostbite(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  char *txt;
  AFFECT_DATA *pAVar4;
  short sVar5;
  short sVar6;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  sVar1 = (short)level;
  bVar2 = saves_spell(level,(CHAR_DATA *)vo,5);
  if (bVar2) {
    txt = "You failed.\n\r";
LAB_00314cf9:
    send_to_char(txt,ch);
    return;
  }
  iVar3 = number_range(0,1);
  bVar2 = is_affected((CHAR_DATA *)vo,sn);
  sVar6 = (short)sn;
  AStack_98.type = sVar6;
  AStack_98.level = sVar1;
  if (iVar3 == 0) {
    if ((bVar2) && (*(short *)((long)vo + 0x304) < 2)) {
      txt = "There is no warmth remaining in their arm to be siphoned away.\n\r";
      goto LAB_00314cf9;
    }
    act("$N\'s arm goes limp as you draw heat from it.",ch,(void *)0x0,vo,3);
    act_new("Your arm goes limp as $n draws heat from it.",ch,(void *)0x0,vo,2,4);
    act("$N\'s arm goes limp as $n draws heat from it.",ch,(void *)0x0,vo,1);
    for (pAVar4 = *(AFFECT_DATA **)((long)vo + 0x88); pAVar4 != (AFFECT_DATA *)0x0;
        pAVar4 = pAVar4->next) {
      if ((pAVar4->type == sn) && (pAVar4->location == 1)) {
        affect_remove((CHAR_DATA *)vo,pAVar4);
      }
    }
    init_affect(&AStack_98);
    AStack_98.where = 0;
    AStack_98.aftype = 3;
    sVar5 = (short)(level / 6);
    AStack_98.modifier =
         (short)(uint)((ulong)((long)level * -0x66666667) >> 0x21) -
         (short)((long)level * -0x66666667 >> 0x3f);
    AStack_98.location = 1;
    AStack_98.duration = sVar5;
    affect_to_char((CHAR_DATA *)vo,&AStack_98);
    bVar2 = saves_spell(level + -2,(CHAR_DATA *)vo,5);
    if (bVar2) {
      return;
    }
    act("$N\'s screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!"
        ,ch,(void *)0x0,vo,3);
    act_new("Shooting pains run through your arm as $n chills it, and then suddenly, you have no feeling in it at all."
            ,ch,(void *)0x0,vo,2,4);
    act("$N\'s screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!"
        ,ch,(void *)0x0,vo,1);
    init_affect(&AStack_98);
    AStack_98.location = 0x22;
    AStack_98.modifier = -1;
  }
  else {
    if ((bVar2) && (*(short *)((long)vo + 0x306) < 2)) {
      txt = "There is no warmth remaining in their leg to be siphoned away.\n\r";
      goto LAB_00314cf9;
    }
    act("$N\'s leg goes limp as you draw heat from it.",ch,(void *)0x0,vo,3);
    act_new("Your leg goes limp as $n draws heat from it.",ch,(void *)0x0,vo,2,4);
    act("$N\'s leg goes limp as $n draws heat from it.",ch,(void *)0x0,vo,1);
    for (pAVar4 = *(AFFECT_DATA **)((long)vo + 0x88); pAVar4 != (AFFECT_DATA *)0x0;
        pAVar4 = pAVar4->next) {
      if ((pAVar4->type == sn) && (pAVar4->location == 2)) {
        affect_remove((CHAR_DATA *)vo,pAVar4);
      }
    }
    init_affect(&AStack_98);
    AStack_98.where = 0;
    AStack_98.aftype = 3;
    sVar5 = (short)(level / 6);
    AStack_98.modifier =
         (short)(uint)((ulong)((long)level * -0x66666667) >> 0x21) -
         (short)((long)level * -0x66666667 >> 0x3f);
    AStack_98.location = 2;
    AStack_98.duration = sVar5;
    affect_to_char((CHAR_DATA *)vo,&AStack_98);
    bVar2 = saves_spell(level + -2,(CHAR_DATA *)vo,5);
    if (bVar2) {
      return;
    }
    act("$N nearly collapses to the ground as $S leg is frozen solid!",ch,(void *)0x0,vo,3);
    act_new("Shooting pains run through your leg as $n chills it, and then suddenly, you have no feeling in it at all."
            ,ch,(void *)0x0,vo,2,4);
    act("$N nearly collapses to the ground as $S leg is frozen solid!",ch,(void *)0x0,vo,1);
    init_affect(&AStack_98);
    AStack_98.location = 0x21;
    AStack_98.modifier = -1;
  }
  AStack_98.aftype = 5;
  AStack_98.where = 0;
  AStack_98.type = sVar6;
  AStack_98.level = sVar1;
  AStack_98.duration = sVar5;
  affect_to_char((CHAR_DATA *)vo,&AStack_98);
  return;
}

Assistant:

void spell_frostbite(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af, *paf;

	if (saves_spell(level, victim, DAM_COLD))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (number_range(0, 1) == 0)
	{
		if (is_affected(victim, sn) && victim->arms < 2)
		{
			send_to_char("There is no warmth remaining in their arm to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's arm goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your arm goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's arm goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_STR)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_STR;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your arm as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N's screams in pain as $S arm, now a pale bluish-white color, dangles uselessly at $S side!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_ARMS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
	else
	{
		if (is_affected(victim, sn) && victim->legs < 2)
		{
			send_to_char("There is no warmth remaining in their leg to be siphoned away.\n\r", ch);
			return;
		}

		act("$N's leg goes limp as you draw heat from it.", ch, 0, victim, TO_CHAR);
		act_new("Your leg goes limp as $n draws heat from it.", ch, 0, victim, TO_VICT, POS_SLEEPING);
		act("$N's leg goes limp as $n draws heat from it.", ch, 0, victim, TO_NOTVICT);

		for (paf = victim->affected; paf != nullptr; paf = paf->next)
		{
			if (paf->type == sn && paf->location == APPLY_DEX)
				affect_remove(victim, paf);
		}

		init_affect(&af);
		af.where = TO_AFFECTS;
		af.aftype = AFT_MALADY;
		af.type = sn;
		af.location = APPLY_DEX;
		af.duration = level / 6;
		af.level = level;
		af.modifier = -(level / 5);
		affect_to_char(victim, &af);

		if (!saves_spell(level - 2, victim, DAM_COLD))
		{
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_CHAR);
			act_new("Shooting pains run through your leg as $n chills it, and then suddenly, you have no feeling in it at all.", ch, 0, victim, TO_VICT, POS_SLEEPING);
			act("$N nearly collapses to the ground as $S leg is frozen solid!", ch, 0, victim, TO_NOTVICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.aftype = AFT_INVIS;
			af.type = sn;
			af.location = APPLY_LEGS;
			af.duration = level / 6;
			af.level = level;
			af.modifier = -1;
			affect_to_char(victim, &af);
		}
	}
}